

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bias_x86.cpp
# Opt level: O2

int __thiscall ncnn::Bias_x86::forward_inplace(Bias_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  void *pvVar2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  int iVar6;
  ulong uVar7;
  float *pfVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  
  iVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
  pvVar2 = (this->super_Bias).bias_data.data;
  uVar9 = 0;
  uVar7 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar7 = uVar9;
  }
  for (; uVar9 != uVar7; uVar9 = uVar9 + 1) {
    pvVar3 = bottom_top_blob->data;
    sVar4 = bottom_top_blob->elemsize;
    sVar5 = bottom_top_blob->cstep;
    pfVar8 = (float *)(sVar5 * uVar9 * sVar4 + (long)pvVar3);
    fVar1 = *(float *)((long)pvVar2 + uVar9 * 4);
    lVar10 = 0;
    for (iVar12 = 0; iVar12 + 3 < iVar6; iVar12 = iVar12 + 4) {
      *pfVar8 = *pfVar8 + fVar1;
      pfVar8[1] = pfVar8[1] + fVar1;
      pfVar8[2] = pfVar8[2] + fVar1;
      pfVar8[3] = pfVar8[3] + fVar1;
      pfVar8 = pfVar8 + 4;
      lVar10 = lVar10 + 4;
    }
    lVar11 = sVar5 * sVar4 * uVar9;
    for (; (int)lVar10 < iVar6; lVar10 = lVar10 + 1) {
      *(float *)((long)pvVar3 + lVar10 * 4 + lVar11) =
           *(float *)((long)pvVar3 + lVar10 * 4 + lVar11) + fVar1;
    }
  }
  return 0;
}

Assistant:

int Bias_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int size = w * h * d;

    const float* bias_ptr = bias_data;
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        float bias = bias_ptr[q];

        int i = 0;
#if __SSE2__
#if __AVX__
        {
            __m256 _bias256 = _mm256_set1_ps(bias);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _outp = _mm256_add_ps(_p, _bias256);
                _mm256_storeu_ps(ptr, _outp);

                ptr += 8;
            }
        }
#endif // __AVX__
        {
            __m128 _bias = _mm_set1_ps(bias);
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _outp = _mm_add_ps(_p, _bias);
                _mm_storeu_ps(ptr, _outp);

                ptr += 4;
            }
        }
#endif // __SSE2__

        for (; i < size; i++)
        {
            *ptr = *ptr + bias;

            ptr++;
        }
    }

    return 0;
}